

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O3

void __thiscall
QScrollerPrivate::handleDrag(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  QScrollerPropertiesPrivate *pQVar1;
  long lVar2;
  QPointF QVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  int iVar8;
  undefined4 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QDebug QVar12;
  int iVar13;
  char *pcVar14;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  undefined4 uVar20;
  int iVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QDebug local_70;
  QPointF local_68;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  dVar4 = position->xp - (this->lastPosition).xp;
  dVar5 = position->yp - (this->lastPosition).yp;
  local_68.yp._0_4_ = SUB84(dVar5,0);
  local_68.xp = dVar4;
  local_68.yp._4_4_ = (int)((ulong)dVar5 >> 0x20);
  lVar2 = this->lastTimestamp;
  if ((pQVar1->axisLockThreshold != 0.0) || (NAN(pQVar1->axisLockThreshold))) {
    uVar17 = -(ulong)(dVar4 < -dVar4);
    uVar18 = -(ulong)(dVar5 < -dVar5);
    uVar7 = (ulong)-dVar5 & uVar18;
    auVar23._0_8_ = ~uVar17 & (ulong)dVar4;
    auVar23._8_8_ = ~uVar18 & (ulong)dVar5;
    auVar6._8_4_ = (int)uVar7;
    auVar6._0_8_ = (ulong)-dVar4 & uVar17;
    auVar6._12_4_ = (int)(uVar7 >> 0x20);
    iVar19 = (int)SUB168(auVar23 | auVar6,0);
    iVar21 = (int)SUB168(auVar23 | auVar6,8);
    auVar24._0_4_ = -(uint)(iVar19 == 0);
    auVar24._4_4_ = -(uint)(iVar19 == 0);
    auVar24._8_4_ = -(uint)(iVar21 == 0);
    auVar24._12_4_ = -(uint)(iVar21 == 0);
    iVar13 = movmskpd((int)local_38,auVar24);
    if (iVar13 != 3) {
      iVar13 = iVar19;
      if (iVar21 < iVar19) {
        iVar13 = iVar21;
      }
      iVar8 = iVar19;
      if (iVar19 < iVar21) {
        iVar8 = iVar21;
      }
      lcScroller();
      if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
        QMessageLogger::debug();
        QVar12.stream = local_70.stream;
        QVar25.m_data = (storage_type *)0x25;
        QVar25.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar25);
        QTextStream::operator<<((QTextStream *)QVar12.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QTextStream::operator<<((QTextStream *)local_70.stream,(double)iVar13 / (double)iVar8);
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QVar12.stream = local_70.stream;
        QVar26.m_data = (storage_type *)0x3;
        QVar26.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar26);
        QTextStream::operator<<((QTextStream *)QVar12.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QTextStream::operator<<((QTextStream *)local_70.stream,pQVar1->axisLockThreshold);
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QVar12.stream = local_70.stream;
        QVar27.m_data = (storage_type *)0xd;
        QVar27.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar27);
        QTextStream::operator<<((QTextStream *)QVar12.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        pcVar14 = "false";
        if (iVar19 < iVar21) {
          pcVar14 = "true";
        }
        QTextStream::operator<<((QTextStream *)local_70.stream,pcVar14);
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QVar12.stream = local_70.stream;
        QVar28.m_data = (storage_type *)0x5;
        QVar28.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar28);
        QTextStream::operator<<((QTextStream *)QVar12.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QTextStream::operator<<((QTextStream *)local_70.stream,iVar19);
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QVar12.stream = local_70.stream;
        QVar29.m_data = (storage_type *)0x5;
        QVar29.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar29);
        QTextStream::operator<<((QTextStream *)QVar12.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QTextStream::operator<<((QTextStream *)local_70.stream,iVar21);
        if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_70.stream,' ');
        }
        QDebug::~QDebug(&local_70);
      }
      if ((double)iVar13 / (double)iVar8 <= pQVar1->axisLockThreshold) {
        if (iVar19 < iVar21) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_68.yp;
          local_68 = (QPointF)(auVar10 << 0x40);
        }
        else {
          local_68.yp = 0.0;
        }
      }
    }
  }
  updateVelocity(this,&local_68,timestamp - lVar2);
  bVar16 = true;
  bVar15 = true;
  if ((this->contentPosRange).w <= 0.0) {
    bVar15 = pQVar1->hOvershootPolicy == OvershootAlwaysOn;
  }
  if ((this->contentPosRange).h <= 0.0) {
    bVar16 = pQVar1->vOvershootPolicy == OvershootAlwaysOn;
  }
  if (!bVar15) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_68.yp;
    local_68 = (QPointF)(auVar11 << 0x40);
    (this->releaseVelocity).xp = 0.0;
  }
  if (bVar16) {
    uVar20 = local_68.yp._0_4_;
    uVar22 = local_68.yp._4_4_;
  }
  else {
    (this->releaseVelocity).yp = 0.0;
    uVar20 = 0;
    uVar22 = 0;
  }
  dVar4 = (this->dragDistance).yp + (double)CONCAT44(uVar22,uVar20);
  QVar3.yp._0_4_ = SUB84(dVar4,0);
  QVar3.xp = (this->dragDistance).xp + local_68.xp;
  QVar3.yp._4_4_ = (int)((ulong)dVar4 >> 0x20);
  this->dragDistance = QVar3;
  uVar20 = *(undefined4 *)((long)&position->xp + 4);
  uVar22 = *(undefined4 *)&position->yp;
  uVar9 = *(undefined4 *)((long)&position->yp + 4);
  *(undefined4 *)&(this->lastPosition).xp = *(undefined4 *)&position->xp;
  *(undefined4 *)((long)&(this->lastPosition).xp + 4) = uVar20;
  *(undefined4 *)&(this->lastPosition).yp = uVar22;
  *(undefined4 *)((long)&(this->lastPosition).yp + 4) = uVar9;
  this->lastTimestamp = timestamp;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollerPrivate::handleDrag(const QPointF &position, qint64 timestamp)
{
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    QPointF deltaPixel = position - lastPosition;
    qint64 deltaTime = timestamp - lastTimestamp;

    if (sp->axisLockThreshold) {
        int dx = qAbs(deltaPixel.x());
        int dy = qAbs(deltaPixel.y());
        if (dx || dy) {
            bool vertical = (dy > dx);
            qreal alpha = qreal(vertical ? dx : dy) / qreal(vertical ? dy : dx);
            qCDebug(lcScroller) << "QScroller::handleDrag() -- axis lock:" << alpha << " / " << sp->axisLockThreshold
                                << "- isvertical:" << vertical << "- dx:" << dx << "- dy:" << dy;
            if (alpha <= sp->axisLockThreshold) {
                if (vertical)
                    deltaPixel.setX(0);
                else
                    deltaPixel.setY(0);
            }
        }
    }

    // calculate velocity (if the user would release the mouse NOW)
    updateVelocity(deltaPixel, deltaTime);

    // restrict velocity, if content is not scrollable
    QRectF max = contentPosRange;
    bool canScrollX = (max.width() > 0) || (sp->hOvershootPolicy == QScrollerProperties::OvershootAlwaysOn);
    bool canScrollY = (max.height() > 0) || (sp->vOvershootPolicy == QScrollerProperties::OvershootAlwaysOn);

    if (!canScrollX) {
        deltaPixel.setX(0);
        releaseVelocity.setX(0);
    }
    if (!canScrollY) {
        deltaPixel.setY(0);
        releaseVelocity.setY(0);
    }

    dragDistance += deltaPixel;
    lastPosition = position;
    lastTimestamp = timestamp;
}